

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

void vkt::anon_unknown_0::declareUniforms(ostringstream *out,ValueBlock *valueBlock)

{
  ValueBlock *out_00;
  bool bVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ValueBlock *local_18;
  ValueBlock *valueBlock_local;
  ostringstream *out_local;
  
  local_18 = valueBlock;
  valueBlock_local = (ValueBlock *)out;
  bVar1 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::empty(&valueBlock->uniforms)
  ;
  out_00 = valueBlock_local;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Uniforms",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    genUniformBlock((ostringstream *)out_00,&local_38,&local_70,0,1,&local_18->uniforms);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

void declareUniforms (ostringstream& out, const ValueBlock& valueBlock)
{
	if (!valueBlock.uniforms.empty())
		genUniformBlock(out, "Uniforms", "", 0, USER_UNIFORM_BINDING, valueBlock.uniforms);
}